

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  byte in_SIL;
  ImVec4 *in_RDI;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  ImDrawList *unaff_retaddr;
  ImVec4 current;
  ImVec4 cr;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float fStack_38;
  float local_34;
  float fStack_30;
  ImVec4 local_2c;
  byte local_19;
  
  local_19 = in_SIL & 1;
  ImVec4::ImVec4(&local_2c,in_XMM0_Da,in_XMM0_Db,in_XMM1_Da,in_XMM1_Db);
  if (((local_19 & 1) != 0) && (in_RDI[6].x != 0.0)) {
    puVar2 = (undefined8 *)(*(long *)&in_RDI[6].z + (long)((int)in_RDI[6].x + -1) * 0x10);
    uVar1 = *puVar2;
    in_stack_ffffffffffffffc4 = (float)uVar1;
    fStack_38 = (float)((ulong)uVar1 >> 0x20);
    uVar1 = puVar2[1];
    if (local_2c.x < in_stack_ffffffffffffffc4) {
      local_2c.x = in_stack_ffffffffffffffc4;
    }
    if (local_2c.y < fStack_38) {
      local_2c.y = fStack_38;
    }
    local_34 = (float)uVar1;
    if (local_34 < local_2c.z) {
      local_2c.z = local_34;
    }
    fStack_30 = (float)((ulong)uVar1 >> 0x20);
    if (fStack_30 < local_2c.w) {
      local_2c.w = fStack_30;
    }
  }
  local_2c.z = ImMax<float>(local_2c.x,local_2c.z);
  local_2c.w = ImMax<float>(local_2c.y,local_2c.w);
  ImVector<ImVec4>::push_back
            ((ImVector<ImVec4> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_RDI);
  UpdateClipRect(unaff_retaddr);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect && _ClipRectStack.Size)
    {
        ImVec4 current = _ClipRectStack.Data[_ClipRectStack.Size-1];
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    UpdateClipRect();
}